

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketManager.cpp
# Opt level: O2

SOCK SocketManager::accept_sock(SOCK serv_sock)

{
  int iVar1;
  socklen_t clnt_addr_size;
  sockaddr_in clnt_addr;
  socklen_t local_1c;
  sockaddr local_18;
  
  local_1c = 0x10;
  iVar1 = accept(serv_sock,&local_18,&local_1c);
  puts("accept");
  return iVar1;
}

Assistant:

SOCK SocketManager::accept_sock(SOCK serv_sock) {
    SOCK ret;
#ifdef UNIX_PLATFORM
    struct sockaddr_in clnt_addr;
    socklen_t clnt_addr_size = sizeof(clnt_addr);
    ret = accept(serv_sock, (struct sockaddr*)&clnt_addr, &clnt_addr_size);
#else
    SOCKADDR clnt_addr;
    int nSize = sizeof(SOCKADDR);
    ret = accept(serv_sock, (SOCKADDR*)&clnt_addr, &nSize);
#endif
    DBGprint("accept\n");
    return ret;
}